

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher_manager.cc
# Opt level: O1

void __thiscall
iqxmlrpc::Method_dispatcher_manager::get_methods_list(Method_dispatcher_manager *this,Array *retval)

{
  Impl *pIVar1;
  _Map_pointer pppMVar2;
  _Elt_pointer ppMVar3;
  _Elt_pointer ppMVar4;
  
  pIVar1 = this->impl_;
  ppMVar4 = (pIVar1->dispatchers).
            super__Deque_base<iqxmlrpc::Method_dispatcher_base_*,_std::allocator<iqxmlrpc::Method_dispatcher_base_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (ppMVar4 !=
      (pIVar1->dispatchers).
      super__Deque_base<iqxmlrpc::Method_dispatcher_base_*,_std::allocator<iqxmlrpc::Method_dispatcher_base_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    ppMVar3 = (pIVar1->dispatchers).
              super__Deque_base<iqxmlrpc::Method_dispatcher_base_*,_std::allocator<iqxmlrpc::Method_dispatcher_base_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    pppMVar2 = (pIVar1->dispatchers).
               super__Deque_base<iqxmlrpc::Method_dispatcher_base_*,_std::allocator<iqxmlrpc::Method_dispatcher_base_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppMVar4)->_vptr_Method_dispatcher_base[3])(*ppMVar4,retval);
      ppMVar4 = ppMVar4 + 1;
      if (ppMVar4 == ppMVar3) {
        ppMVar4 = pppMVar2[1];
        pppMVar2 = pppMVar2 + 1;
        ppMVar3 = ppMVar4 + 0x40;
      }
    } while (ppMVar4 !=
             (this->impl_->dispatchers).
             super__Deque_base<iqxmlrpc::Method_dispatcher_base_*,_std::allocator<iqxmlrpc::Method_dispatcher_base_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  return;
}

Assistant:

void Method_dispatcher_manager::get_methods_list(Array& retval) const
{
  typedef Impl::DispatchersSet::const_iterator CI;
  for (CI i = impl_->dispatchers.begin(); i != impl_->dispatchers.end(); ++i)
    (*i)->get_methods_list(retval);
}